

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_6adfde::HandleReplaceExtensionCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmMakefile *this;
  char cVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  offset_in_Result_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> in_RCX;
  pointer pbVar8;
  static_string_view name;
  string_view value;
  string inputPath;
  cmCMakePath path;
  cmCMakePath extension;
  Arguments arguments;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  string local_1a0;
  long *local_180;
  size_t local_178;
  long local_170 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  undefined1 local_140 [16];
  undefined1 local_130 [24];
  _Any_data _Stack_118;
  undefined1 auStack_108 [16];
  _Any_data _Stack_f8;
  pointer ppStack_e8;
  bool local_e0;
  path local_b8;
  undefined1 local_90 [16];
  _Base_ptr local_80;
  _Base_ptr local_78;
  _Base_ptr local_70;
  size_t local_68;
  string local_60;
  char local_40;
  char local_38;
  ArgumentParserWithOutputVariable<Arguments> *pAVar7;
  
  if ((anonymous_namespace)::
      HandleReplaceExtensionCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
      ::parser == '\0') {
    iVar6 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 HandleReplaceExtensionCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                 ::parser);
    if (iVar6 != 0) {
      ArgumentParserWithOutputVariable<Arguments>::ArgumentParserWithOutputVariable
                ((ArgumentParserWithOutputVariable<Arguments> *)local_140);
      name.super_string_view._M_str = "LAST_ONLY";
      name.super_string_view._M_len = 9;
      pAVar7 = (ArgumentParserWithOutputVariable<Arguments> *)0x9;
      ArgumentParserWithOutputVariable<Arguments>::Bind<bool>
                ((ArgumentParserWithOutputVariable<Arguments> *)local_140,name,in_RCX);
      ArgumentParserWithOutputVariable<Arguments>::ArgumentParserWithOutputVariable
                ((ArgumentParserWithOutputVariable<Arguments> *)local_140,pAVar7);
      CMakePathArgumentParser<Arguments>::~CMakePathArgumentParser
                ((CMakePathArgumentParser<Arguments> *)local_140);
      __cxa_atexit(CMakePathArgumentParser<Arguments>::~CMakePathArgumentParser,
                   &HandleReplaceExtensionCommand::parser,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           HandleReplaceExtensionCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::parser);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&HandleReplaceExtensionCommand::parser.super_CMakePathArgumentParser<Arguments>.
                     Inputs,HandleReplaceExtensionCommand::parser.
                            super_CMakePathArgumentParser<Arguments>.Inputs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  local_b8._M_pathname._M_string_length =
       (size_type)
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_b8._M_pathname._M_dataplus._M_p =
       (pointer)((args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 2);
  local_78 = (_Base_ptr)(local_90 + 8);
  local_90._8_4_ = _S_red;
  local_80 = (_Base_ptr)0x0;
  local_68 = 0;
  local_40 = '\0';
  local_38 = '\0';
  local_140._0_8_ = &HandleReplaceExtensionCommand::parser;
  local_140._8_8_ = local_90;
  local_130._0_8_ =
       &HandleReplaceExtensionCommand::parser.super_CMakePathArgumentParser<Arguments>.Inputs;
  local_130._16_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  _Stack_118._M_unused._M_object = (char *)0x0;
  _Stack_118._8_8_ = 0;
  auStack_108._0_8_ = (_Manager_type)0x0;
  auStack_108._8_8_ = 0;
  _Stack_f8._0_8_ = 0;
  _Stack_f8._8_8_ = (_Manager_type)0x0;
  ppStack_e8 = (pointer)0x0;
  local_e0 = false;
  local_130._8_8_ = local_140._8_8_;
  local_70 = local_78;
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)local_140,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&local_b8,0);
  if ((_Manager_type)_Stack_f8._8_8_ != (_Manager_type)0x0) {
    (*(code *)_Stack_f8._8_8_)(auStack_108 + 8,auStack_108 + 8,3);
  }
  bVar4 = ArgumentParser::ParseResult::MaybeReportError((ParseResult *)local_90,status->Makefile);
  bVar5 = true;
  if (!bVar4) {
    if ((ulong)((long)HandleReplaceExtensionCommand::parser.super_CMakePathArgumentParser<Arguments>
                      .Inputs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)HandleReplaceExtensionCommand::parser.super_CMakePathArgumentParser<Arguments>.
                     Inputs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
      local_1a0._M_string_length = 0;
      local_1a0.field_2._M_local_buf[0] = '\0';
      bVar5 = getInputPath((args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1,status,&local_1a0);
      if (bVar5) {
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_160,local_1a0._M_dataplus._M_p,
                   local_1a0._M_dataplus._M_p + local_1a0._M_string_length);
        cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                  ((cmCMakePath *)local_140,&local_160,generic_format);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        paVar1 = &local_1c0.field_2;
        local_1c0._M_dataplus._M_p = (pointer)paVar1;
        if (HandleReplaceExtensionCommand::parser.super_CMakePathArgumentParser<Arguments>.Inputs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            HandleReplaceExtensionCommand::parser.super_CMakePathArgumentParser<Arguments>.Inputs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"");
        }
        else {
          pcVar2 = ((HandleReplaceExtensionCommand::parser.super_CMakePathArgumentParser<Arguments>.
                     Inputs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1c0,pcVar2,
                     pcVar2 + (HandleReplaceExtensionCommand::parser.
                               super_CMakePathArgumentParser<Arguments>.Inputs.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
        }
        cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                  ((cmCMakePath *)&local_b8,&local_1c0,generic_format);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != paVar1) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
        }
        if (local_38 == '\x01') {
          std::filesystem::__cxx11::path::replace_extension((path *)local_140);
        }
        else {
          cmCMakePath::ReplaceWideExtension((cmCMakePath *)local_140,(cmCMakePath *)&local_b8);
        }
        cVar3 = local_40;
        this = status->Makefile;
        pbVar8 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_180 = local_170;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_180,local_140._0_8_,
                   (pointer)(local_140._0_8_ +
                            (long)(map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_140._8_8_));
        pbVar8 = pbVar8 + 1;
        if (cVar3 != '\0') {
          pbVar8 = &local_60;
        }
        value._M_str = (char *)local_180;
        value._M_len = local_178;
        cmMakefile::AddDefinition(this,pbVar8,value);
        if (local_180 != local_170) {
          operator_delete(local_180,local_170[0] + 1);
        }
        std::filesystem::__cxx11::path::~path(&local_b8);
        std::filesystem::__cxx11::path::~path((path *)local_140);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,
                        CONCAT71(local_1a0.field_2._M_allocated_capacity._1_7_,
                                 local_1a0.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      local_140._0_8_ = (ActionMap *)local_130;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_140,"REPLACE_EXTENSION called with unexpected arguments.","");
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((ActionMap *)local_140._0_8_ != (ActionMap *)local_130) {
        operator_delete((void *)local_140._0_8_,(ulong)(local_130._0_8_ + 1));
      }
      bVar5 = false;
    }
  }
  if (local_40 == '\x01') {
    local_40 = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_90);
  return bVar5;
}

Assistant:

bool HandleReplaceExtensionCommand(std::vector<std::string> const& args,
                                   cmExecutionStatus& status)
{
  struct Arguments : public ArgumentParser::ParseResult
  {
    cm::optional<ArgumentParser::NonEmpty<std::string>> Output;
    bool LastOnly = false;
  };

  static auto const parser =
    ArgumentParserWithOutputVariable<Arguments>{}.Bind("LAST_ONLY"_s,
                                                       &Arguments::LastOnly);

  Arguments const arguments = parser.Parse(args);

  if (arguments.MaybeReportError(status.GetMakefile())) {
    return true;
  }

  if (parser.GetInputs().size() > 1) {
    status.SetError("REPLACE_EXTENSION called with unexpected arguments.");
    return false;
  }

  std::string inputPath;
  if (!getInputPath(args[1], status, inputPath)) {
    return false;
  }

  cmCMakePath path(inputPath);
  cmCMakePath extension(
    parser.GetInputs().empty() ? "" : parser.GetInputs().front());

  if (arguments.LastOnly) {
    path.ReplaceExtension(extension);
  } else {
    path.ReplaceWideExtension(extension);
  }

  status.GetMakefile().AddDefinition(
    arguments.Output ? *arguments.Output : args[1], path.String());

  return true;
}